

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O0

ConfigStrings<std::shared_ptr<cmQtAutoGen::CompilerFeatures>_> * __thiscall
cmQtAutoGenGlobalInitializer::GetCompilerFeatures
          (ConfigStrings<std::shared_ptr<cmQtAutoGen::CompilerFeatures>_> *__return_storage_ptr__,
          cmQtAutoGenGlobalInitializer *this,string *generator,ConfigString *executable,
          string *error,bool isMultiConfig,bool UseBetterGraph)

{
  bool bVar1;
  mapped_type *pmVar2;
  pointer ppVar3;
  mapped_type *pmVar4;
  __shared_ptr_access<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *peVar5;
  unordered_map<std::__cxx11::string,std::shared_ptr<cmQtAutoGen::CompilerFeatures>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cmQtAutoGen::CompilerFeatures>>>>
  *this_01;
  char *retVal_00;
  int *retVal_01;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  undefined1 auVar6 [16];
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_false,_true>,_bool>
  pVar7;
  shared_ptr<cmQtAutoGen::CompilerFeatures> local_3a8;
  char local_392 [2];
  string local_390;
  undefined1 local_370 [16];
  string local_360;
  string local_340;
  rep_conflict local_320;
  undefined1 local_315;
  int local_314;
  undefined1 local_310 [3];
  bool runResult_1;
  int retVal_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command_1;
  string stdErr_1;
  string stdOut;
  string local_2a8;
  string local_288;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
  local_268;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
  local_260;
  iterator it_1;
  shared_ptr<cmQtAutoGen::CompilerFeatures> local_248;
  shared_ptr<cmQtAutoGen::CompilerFeatures> local_238;
  char local_222 [2];
  string local_220;
  undefined1 local_200 [16];
  string local_1f0;
  string local_1d0;
  rep_conflict local_1b0;
  undefined1 local_1a5;
  undefined1 local_1a4 [4];
  undefined1 local_1a0 [3];
  bool runResult;
  int retVal;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  string stdErr;
  string stdOut_1;
  string local_128;
  string local_108;
  uint local_e4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
  local_e0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
  local_d8;
  iterator it;
  undefined1 local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> exe;
  value_type *config;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  ConfigStrings<std::shared_ptr<cmQtAutoGen::CompilerFeatures>_> res;
  bool UseBetterGraph_local;
  bool isMultiConfig_local;
  string *error_local;
  ConfigString *executable_local;
  string *generator_local;
  cmQtAutoGenGlobalInitializer *this_local;
  
  retVal_00 = (char *)(CONCAT71((int7)((ulong)this >> 8),isMultiConfig) & 0xffffffffffffff01);
  res.Config._M_h._M_single_bucket._7_1_ = (byte)retVal_00;
  res.Config._M_h._M_single_bucket._6_1_ = UseBetterGraph;
  cmQtAutoGen::ConfigStrings<std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>::ConfigStrings
            ((ConfigStrings<std::shared_ptr<cmQtAutoGen::CompilerFeatures>_> *)&__range2);
  if (((res.Config._M_h._M_single_bucket._7_1_ & 1) == 0) ||
     ((res.Config._M_h._M_single_bucket._6_1_ & 1) == 0)) {
    local_260._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
         ::find(&(this->CompilerFeatures_).Default,&executable->Default);
    local_268._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
         ::end(&(this->CompilerFeatures_).Default);
    bVar1 = std::__detail::operator!=(&local_260,&local_268);
    if (bVar1) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_false,_true>
                             *)&local_260);
      std::shared_ptr<cmQtAutoGen::CompilerFeatures>::operator=
                ((shared_ptr<cmQtAutoGen::CompilerFeatures> *)&__range2,&ppVar3->second);
      cmQtAutoGen::ConfigStrings<std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>::ConfigStrings
                (__return_storage_ptr__,
                 (ConfigStrings<std::shared_ptr<cmQtAutoGen::CompilerFeatures>_> *)&__range2);
      local_e4 = 1;
    }
    else {
      bVar1 = cmsys::SystemTools::FileExists(&executable->Default,true);
      if (bVar1) {
        std::__cxx11::string::string((string *)(stdErr_1.field_2._M_local_buf + 8));
        std::__cxx11::string::string
                  ((string *)
                   &command_1.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_310);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_310,
                   &executable->Default);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_310,
                   (char (*) [3])"-h");
        local_314 = 0;
        local_320 = (rep_conflict)std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
        retVal_01 = &local_314;
        bVar1 = cmSystemTools::RunSingleCommand
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_310,(string *)((long)&stdErr_1.field_2 + 8),
                           (string *)
                           &command_1.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,retVal_01,(char *)0x0
                           ,OUTPUT_NONE,(cmDuration)local_320,Auto);
        local_315 = bVar1;
        if (!bVar1) {
          local_370 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)executable)
          ;
          text_02._M_len = local_370._8_8_;
          text_02._M_str = (char *)retVal_01;
          cmQtAutoGen::Quoted_abi_cxx11_(&local_360,local_370._0_8_,text_02);
          cmQtAutoGen::QuotedCommand
                    (&local_390,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_310);
          local_392[1] = 10;
          local_392[0] = '\n';
          cmStrCat<char_const(&)[14],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string,char_const(&)[10],std::__cxx11::string,char,std::__cxx11::string&,char,std::__cxx11::string&>
                    (&local_340,(char (*) [14])"Test run of \"",generator,
                     (char (*) [14])"\" executable ",&local_360,(char (*) [10])" failed.\n",
                     &local_390,local_392 + 1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&stdErr_1.field_2 + 8),local_392,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &command_1.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::operator=((string *)error,(string *)&local_340);
          std::__cxx11::string::~string((string *)&local_340);
          std::__cxx11::string::~string((string *)&local_390);
          std::__cxx11::string::~string((string *)&local_360);
          memset(__return_storage_ptr__,0,0x48);
          cmQtAutoGen::ConfigStrings<std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>::ConfigStrings
                    (__return_storage_ptr__);
        }
        local_e4 = (uint)!bVar1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_310);
        std::__cxx11::string::~string
                  ((string *)
                   &command_1.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (local_e4 == 0) {
          std::make_shared<cmQtAutoGen::CompilerFeatures>();
          std::shared_ptr<cmQtAutoGen::CompilerFeatures>::operator=
                    ((shared_ptr<cmQtAutoGen::CompilerFeatures> *)&__range2,&local_3a8);
          std::shared_ptr<cmQtAutoGen::CompilerFeatures>::~shared_ptr(&local_3a8);
          peVar5 = std::
                   __shared_ptr_access<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&__range2);
          std::__cxx11::string::operator=
                    ((string *)&peVar5->HelpOutput,(string *)(stdErr_1.field_2._M_local_buf + 8));
          std::
          unordered_map<std::__cxx11::string,std::shared_ptr<cmQtAutoGen::CompilerFeatures>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cmQtAutoGen::CompilerFeatures>>>>
          ::emplace<std::__cxx11::string_const&,std::shared_ptr<cmQtAutoGen::CompilerFeatures>&>
                    ((unordered_map<std::__cxx11::string,std::shared_ptr<cmQtAutoGen::CompilerFeatures>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cmQtAutoGen::CompilerFeatures>>>>
                      *)&this->CompilerFeatures_,&executable->Default,
                     (shared_ptr<cmQtAutoGen::CompilerFeatures> *)&__range2);
          cmQtAutoGen::ConfigStrings<std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>::ConfigStrings
                    (__return_storage_ptr__,
                     (ConfigStrings<std::shared_ptr<cmQtAutoGen::CompilerFeatures>_> *)&__range2);
          local_e4 = 1;
        }
        std::__cxx11::string::~string((string *)(stdErr_1.field_2._M_local_buf + 8));
      }
      else {
        auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)executable);
        text_01._M_len = auVar6._8_8_;
        text_01._M_str = retVal_00;
        cmQtAutoGen::Quoted_abi_cxx11_(&local_2a8,auVar6._0_8_,text_01);
        cmStrCat<char_const(&)[6],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string,char_const(&)[17]>
                  (&local_288,(char (*) [6])"The \"",generator,(char (*) [14])"\" executable ",
                   &local_2a8,(char (*) [17])0x1252a2a);
        std::__cxx11::string::operator=((string *)error,(string *)&local_288);
        std::__cxx11::string::~string((string *)&local_288);
        std::__cxx11::string::~string((string *)&local_2a8);
        memset(__return_storage_ptr__,0,0x48);
        cmQtAutoGen::ConfigStrings<std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>::ConfigStrings
                  (__return_storage_ptr__);
        local_e4 = 1;
      }
    }
  }
  else {
    __end2 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(&executable->Config);
    config = (value_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end(&executable->Config);
    while( true ) {
      bVar1 = std::__detail::operator!=
                        (&__end2.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                         ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                           *)&config);
      if (!bVar1) break;
      exe.field_2._8_8_ =
           std::__detail::
           _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
           ::operator*(&__end2);
      std::__cxx11::string::string
                ((string *)local_c0,(string *)&((reference)exe.field_2._8_8_)->second);
      pmVar2 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>_>_>_>
               ::operator[](&(this->CompilerFeatures_).Config,(key_type *)exe.field_2._8_8_);
      local_d8._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
           ::find(pmVar2,(key_type *)local_c0);
      pmVar2 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>_>_>_>
               ::operator[](&(this->CompilerFeatures_).Config,(key_type *)exe.field_2._8_8_);
      local_e0._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
           ::end(pmVar2);
      bVar1 = std::__detail::operator!=(&local_d8,&local_e0);
      if (bVar1) {
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_false,_true>
                               *)&local_d8);
        pmVar4 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
                 ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
                               *)&res.Default.
                                  super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount,(key_type *)exe.field_2._8_8_);
        std::shared_ptr<cmQtAutoGen::CompilerFeatures>::operator=(pmVar4,&ppVar3->second);
        local_e4 = 3;
      }
      else {
        bVar1 = cmsys::SystemTools::FileExists((string *)local_c0,true);
        if (bVar1) {
          std::__cxx11::string::string((string *)(stdErr.field_2._M_local_buf + 8));
          std::__cxx11::string::string
                    ((string *)
                     &command.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1a0);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_1a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[3]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_1a0,
                     (char (*) [3])"-h");
          local_1a4 = (undefined1  [4])0x0;
          local_1b0 = (rep_conflict)std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
          retVal_00 = local_1a4;
          local_1a5 = cmSystemTools::RunSingleCommand
                                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_1a0,(string *)((long)&stdErr.field_2 + 8),
                                 (string *)
                                 &command.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (int *)retVal_00,(char *)0x0,OUTPUT_NONE,(cmDuration)local_1b0,Auto
                                );
          if ((bool)local_1a5) {
            local_e4 = 0;
          }
          else {
            auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_c0);
            text_00._M_len = auVar6._8_8_;
            text_00._M_str = retVal_00;
            local_200 = auVar6;
            cmQtAutoGen::Quoted_abi_cxx11_(&local_1f0,auVar6._0_8_,text_00);
            cmQtAutoGen::QuotedCommand
                      (&local_220,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1a0);
            local_222[1] = 10;
            local_222[0] = '\n';
            retVal_00 = "\" executable ";
            cmStrCat<char_const(&)[14],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string,char_const(&)[10],std::__cxx11::string,char,std::__cxx11::string&,char,std::__cxx11::string&>
                      (&local_1d0,(char (*) [14])"Test run of \"",generator,
                       (char (*) [14])"\" executable ",&local_1f0,(char (*) [10])" failed.\n",
                       &local_220,local_222 + 1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&stdErr.field_2 + 8),local_222,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &command.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__cxx11::string::operator=((string *)error,(string *)&local_1d0);
            std::__cxx11::string::~string((string *)&local_1d0);
            std::__cxx11::string::~string((string *)&local_220);
            std::__cxx11::string::~string((string *)&local_1f0);
            std::shared_ptr<cmQtAutoGen::CompilerFeatures>::shared_ptr(&local_238);
            pmVar4 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
                     ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
                                   *)&res.Default.
                                      super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount,(key_type *)exe.field_2._8_8_);
            std::shared_ptr<cmQtAutoGen::CompilerFeatures>::operator=(pmVar4,&local_238);
            std::shared_ptr<cmQtAutoGen::CompilerFeatures>::~shared_ptr(&local_238);
            local_e4 = 3;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1a0);
          std::__cxx11::string::~string
                    ((string *)
                     &command.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (local_e4 == 0) {
            std::make_shared<cmQtAutoGen::CompilerFeatures>();
            pmVar4 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
                     ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
                                   *)&res.Default.
                                      super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount,(key_type *)exe.field_2._8_8_);
            std::shared_ptr<cmQtAutoGen::CompilerFeatures>::operator=(pmVar4,&local_248);
            std::shared_ptr<cmQtAutoGen::CompilerFeatures>::~shared_ptr(&local_248);
            this_00 = (__shared_ptr_access<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)std::
                         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
                         ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
                                       *)&res.Default.
                                          super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount,(key_type *)exe.field_2._8_8_);
            peVar5 = std::
                     __shared_ptr_access<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->(this_00);
            std::__cxx11::string::operator=
                      ((string *)&peVar5->HelpOutput,(string *)(stdErr.field_2._M_local_buf + 8));
            this_01 = (unordered_map<std::__cxx11::string,std::shared_ptr<cmQtAutoGen::CompilerFeatures>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cmQtAutoGen::CompilerFeatures>>>>
                       *)std::
                         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>_>_>_>
                         ::operator[](&(this->CompilerFeatures_).Config,
                                      (key_type *)exe.field_2._8_8_);
            pmVar4 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
                     ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
                                   *)&res.Default.
                                      super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount,(key_type *)exe.field_2._8_8_);
            pVar7 = std::
                    unordered_map<std::__cxx11::string,std::shared_ptr<cmQtAutoGen::CompilerFeatures>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cmQtAutoGen::CompilerFeatures>>>>
                    ::
                    emplace<std::__cxx11::string_const&,std::shared_ptr<cmQtAutoGen::CompilerFeatures>&>
                              (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_c0,pmVar4);
            retVal_00 = (char *)pVar7.first.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
                                ._M_cur;
            local_e4 = 0;
            it_1.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
            ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
                       )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>,_true>
                         )retVal_00;
          }
          std::__cxx11::string::~string((string *)(stdErr.field_2._M_local_buf + 8));
        }
        else {
          auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_c0);
          text._M_len = auVar6._8_8_;
          text._M_str = retVal_00;
          cmQtAutoGen::Quoted_abi_cxx11_(&local_128,auVar6._0_8_,text);
          retVal_00 = "\" executable ";
          cmStrCat<char_const(&)[6],std::__cxx11::string_const&,char_const(&)[14],std::__cxx11::string,char_const(&)[17]>
                    (&local_108,(char (*) [6])"The \"",generator,(char (*) [14])"\" executable ",
                     &local_128,(char (*) [17])0x1252a2a);
          std::__cxx11::string::operator=((string *)error,(string *)&local_108);
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&local_128);
          std::shared_ptr<cmQtAutoGen::CompilerFeatures>::shared_ptr
                    ((shared_ptr<cmQtAutoGen::CompilerFeatures> *)((long)&stdOut_1.field_2 + 8));
          pmVar4 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
                   ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>_>_>
                                 *)&res.Default.
                                    super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount,(key_type *)exe.field_2._8_8_);
          std::shared_ptr<cmQtAutoGen::CompilerFeatures>::operator=
                    (pmVar4,(shared_ptr<cmQtAutoGen::CompilerFeatures> *)
                            ((long)&stdOut_1.field_2 + 8));
          std::shared_ptr<cmQtAutoGen::CompilerFeatures>::~shared_ptr
                    ((shared_ptr<cmQtAutoGen::CompilerFeatures> *)((long)&stdOut_1.field_2 + 8));
          local_e4 = 3;
        }
      }
      std::__cxx11::string::~string((string *)local_c0);
      std::__detail::
      _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
      ::operator++(&__end2);
    }
    cmQtAutoGen::ConfigStrings<std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>::ConfigStrings
              (__return_storage_ptr__,
               (ConfigStrings<std::shared_ptr<cmQtAutoGen::CompilerFeatures>_> *)&__range2);
    local_e4 = 1;
  }
  cmQtAutoGen::ConfigStrings<std::shared_ptr<cmQtAutoGen::CompilerFeatures>_>::~ConfigStrings
            ((ConfigStrings<std::shared_ptr<cmQtAutoGen::CompilerFeatures>_> *)&__range2);
  return __return_storage_ptr__;
}

Assistant:

cmQtAutoGen::ConfigStrings<cmQtAutoGen::CompilerFeaturesHandle>
cmQtAutoGenGlobalInitializer::GetCompilerFeatures(
  std::string const& generator, cmQtAutoGen::ConfigString const& executable,
  std::string& error, bool const isMultiConfig, bool const UseBetterGraph)
{
  cmQtAutoGen::ConfigStrings<cmQtAutoGen::CompilerFeaturesHandle> res;
  if (isMultiConfig && UseBetterGraph) {
    for (auto const& config : executable.Config) {
      auto const exe = config.second;
      // Check if we have cached features
      {
        auto it = this->CompilerFeatures_.Config[config.first].find(exe);
        if (it != this->CompilerFeatures_.Config[config.first].end()) {
          res.Config[config.first] = it->second;
          continue;
        }
      }

      // Check if the executable exists
      if (!cmSystemTools::FileExists(exe, true)) {
        error = cmStrCat("The \"", generator, "\" executable ",
                         cmQtAutoGen::Quoted(exe), " does not exist.");
        res.Config[config.first] = {};
        continue;
      }

      // Test the executable
      std::string stdOut;
      {
        std::string stdErr;
        std::vector<std::string> command;
        command.emplace_back(exe);
        command.emplace_back("-h");
        int retVal = 0;
        const bool runResult = cmSystemTools::RunSingleCommand(
          command, &stdOut, &stdErr, &retVal, nullptr,
          cmSystemTools::OUTPUT_NONE, cmDuration::zero(),
          cmProcessOutput::Auto);
        if (!runResult) {
          error = cmStrCat("Test run of \"", generator, "\" executable ",
                           cmQtAutoGen::Quoted(exe), " failed.\n",
                           cmQtAutoGen::QuotedCommand(command), '\n', stdOut,
                           '\n', stdErr);
          res.Config[config.first] = {};
          continue;
        }
      }

      // Create valid handle
      res.Config[config.first] =
        std::make_shared<cmQtAutoGen::CompilerFeatures>();
      res.Config[config.first]->HelpOutput = std::move(stdOut);

      // Register compiler features
      this->CompilerFeatures_.Config[config.first].emplace(
        exe, res.Config[config.first]);
    }
    return res;
  }

  // Check if we have cached features
  {
    auto const it = this->CompilerFeatures_.Default.find(executable.Default);
    if (it != this->CompilerFeatures_.Default.end()) {
      res.Default = it->second;
      return res;
    }
  }

  // Check if the executable exists
  if (!cmSystemTools::FileExists(executable.Default, true)) {
    error =
      cmStrCat("The \"", generator, "\" executable ",
               cmQtAutoGen::Quoted(executable.Default), " does not exist.");
    return cmQtAutoGen::ConfigStrings<cmQtAutoGen::CompilerFeaturesHandle>();
  }

  // Test the executable
  std::string stdOut;
  {
    std::string stdErr;
    std::vector<std::string> command;
    command.emplace_back(executable.Default);
    command.emplace_back("-h");
    int retVal = 0;
    const bool runResult = cmSystemTools::RunSingleCommand(
      command, &stdOut, &stdErr, &retVal, nullptr, cmSystemTools::OUTPUT_NONE,
      cmDuration::zero(), cmProcessOutput::Auto);
    if (!runResult) {
      error = cmStrCat("Test run of \"", generator, "\" executable ",
                       cmQtAutoGen::Quoted(executable.Default), " failed.\n",
                       cmQtAutoGen::QuotedCommand(command), '\n', stdOut, '\n',
                       stdErr);
      return cmQtAutoGen::ConfigStrings<cmQtAutoGen::CompilerFeaturesHandle>();
    }
  }

  res.Default = std::make_shared<cmQtAutoGen::CompilerFeatures>();
  res.Default->HelpOutput = std::move(stdOut);

  // Register compiler features
  this->CompilerFeatures_.Default.emplace(executable.Default, res.Default);

  return res;
}